

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int CmpClassNoModule(void *p,void *va,void *vb)

{
  fourcc_t BClass;
  fourcc_t AClass;
  nodeclass **b;
  nodeclass **a;
  void *vb_local;
  void *va_local;
  void *p_local;
  
  if (*(uint *)(*vb + 0x50) < *(uint *)(*va + 0x50)) {
    p_local._4_4_ = 1;
  }
  else if (*(uint *)(*va + 0x50) < *(uint *)(*vb + 0x50)) {
    p_local._4_4_ = -1;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static NOINLINE int CmpClassNoModule(const void* UNUSED_PARAM(p), const void* va, const void* vb)
{
    const nodeclass* const* a = va;
    const nodeclass* const* b = vb;
    fourcc_t AClass = NodeClass_ClassId(*a);
    fourcc_t BClass = NodeClass_ClassId(*b);
    if (AClass > BClass) return 1;
    if (AClass < BClass) return -1;
    return 0;
}